

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapeBroadcastLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  bool bVar1;
  LogMessage *pLVar2;
  mapped_type *pmVar3;
  ShapeRange *pSVar4;
  Type *pTVar5;
  size_t sVar6;
  mapped_type *this_00;
  int iVar7;
  RangeValue RVar8;
  ShapeRange maxWidth;
  ShapeRange maxHeight;
  ShapeRange maxChannel;
  ShapeRange maxSequence;
  ShapeRange maxBatch;
  LogFinisher local_119;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *local_118;
  undefined1 local_110 [24];
  _Alloc_hider _Stack_f8;
  ShapeRange local_d8;
  ShapeRange local_b8;
  ShapeRange local_98;
  ShapeRange local_78;
  ShapeRange local_58;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_110,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_110);
  }
  local_118 = &this->blobShapes;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](local_118,
                        (key_type *)
                        ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
  local_78._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
  local_78._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
  local_78._minimum._val = (pSVar4->_minimum)._val;
  local_78._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
  local_78._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  local_78._maximum._val = (pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::batchRange(pmVar3);
  local_58._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
  local_58._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
  local_58._minimum._val = (pSVar4->_minimum)._val;
  local_58._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
  local_58._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  local_58._maximum._val = (pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::channelRange(pmVar3);
  local_98._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
  local_98._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
  local_98._minimum._val = (pSVar4->_minimum)._val;
  local_98._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
  local_98._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  local_98._maximum._val = (pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::heightRange(pmVar3);
  local_b8._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
  local_b8._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
  local_b8._minimum._val = (pSVar4->_minimum)._val;
  local_b8._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
  local_b8._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  local_b8._maximum._val = (pSVar4->_maximum)._val;
  pSVar4 = ShapeConstraint::widthRange(pmVar3);
  local_d8._minimum._isUnbound = (pSVar4->_minimum)._isUnbound;
  local_d8._minimum._1_7_ = *(undefined7 *)&(pSVar4->_minimum).field_0x1;
  local_d8._minimum._val = (pSVar4->_minimum)._val;
  local_d8._maximum._isUnbound = (pSVar4->_maximum)._isUnbound;
  local_d8._maximum._1_7_ = *(undefined7 *)&(pSVar4->_maximum).field_0x1;
  local_d8._maximum._val = (pSVar4->_maximum)._val;
  bVar1 = ShapeConstraint::hasFixedCHW(pmVar3);
  if (1 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_) {
    iVar7 = 1;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(specLayer->input_).super_RepeatedPtrFieldBase,iVar7);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](local_118,pTVar5);
      if (bVar1 == false) {
        bVar1 = false;
      }
      else {
        bVar1 = ShapeConstraint::hasFixedCHW(pmVar3);
      }
      pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
      ShapeRange::intersect((ShapeRange *)local_110,&local_78,pSVar4);
      local_78._minimum._1_7_ = local_110._1_7_;
      local_78._minimum._isUnbound = local_110[0];
      local_78._maximum._0_8_ = local_110._16_8_;
      local_78._maximum._val = (size_t)_Stack_f8._M_p;
      local_78._minimum._val = local_110._8_8_;
      pSVar4 = ShapeConstraint::batchRange(pmVar3);
      ShapeRange::intersect((ShapeRange *)local_110,&local_58,pSVar4);
      local_58._minimum._1_7_ = local_110._1_7_;
      local_58._minimum._isUnbound = local_110[0];
      local_58._maximum._0_8_ = local_110._16_8_;
      local_58._maximum._val = (size_t)_Stack_f8._M_p;
      local_58._minimum._val = local_110._8_8_;
      pSVar4 = ShapeConstraint::channelRange(pmVar3);
      ShapeRange::unify((ShapeRange *)local_110,&local_98,pSVar4);
      local_98._minimum._1_7_ = local_110._1_7_;
      local_98._minimum._isUnbound = local_110[0];
      local_98._maximum._0_8_ = local_110._16_8_;
      local_98._maximum._val = (size_t)_Stack_f8._M_p;
      local_98._minimum._val = local_110._8_8_;
      pSVar4 = ShapeConstraint::heightRange(pmVar3);
      ShapeRange::unify((ShapeRange *)local_110,&local_b8,pSVar4);
      local_b8._minimum._1_7_ = local_110._1_7_;
      local_b8._minimum._isUnbound = local_110[0];
      local_b8._maximum._0_8_ = local_110._16_8_;
      local_b8._maximum._val = (size_t)_Stack_f8._M_p;
      local_b8._minimum._val = local_110._8_8_;
      pSVar4 = ShapeConstraint::widthRange(pmVar3);
      ShapeRange::unify((ShapeRange *)local_110,&local_d8,pSVar4);
      local_d8._minimum._1_7_ = local_110._1_7_;
      local_d8._minimum._isUnbound = local_110[0];
      local_d8._minimum._val = local_110._8_8_;
      local_d8._maximum._0_8_ = local_110._16_8_;
      local_d8._maximum._val = (size_t)_Stack_f8._M_p;
      iVar7 = iVar7 + 1;
    } while (iVar7 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_110,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_119,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_110);
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](local_118,
                        (key_type *)
                        ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       ((LogMessage *)local_110,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_119,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_110);
  }
  ShapeConstraint::setName
            (pmVar3,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
  ShapeRange::intersect((ShapeRange *)local_110,pSVar4,&local_78);
  ShapeConstraint::updateSequenceRange(pmVar3,(ShapeRange *)local_110);
  pSVar4 = ShapeConstraint::batchRange(pmVar3);
  ShapeRange::intersect((ShapeRange *)local_110,pSVar4,&local_58);
  ShapeConstraint::updateBatchRange(pmVar3,(ShapeRange *)local_110);
  if (bVar1 == false) {
    pSVar4 = ShapeConstraint::channelRange(pmVar3);
    ShapeRange::intersect((ShapeRange *)local_110,pSVar4,&local_98);
    ShapeConstraint::updateChannelRange(pmVar3,(ShapeRange *)local_110);
    pSVar4 = ShapeConstraint::heightRange(pmVar3);
    ShapeRange::intersect((ShapeRange *)local_110,pSVar4,&local_b8);
    ShapeConstraint::updateHeightRange(pmVar3,(ShapeRange *)local_110);
    pSVar4 = ShapeConstraint::widthRange(pmVar3);
    ShapeRange::intersect((ShapeRange *)local_110,pSVar4,&local_d8);
    ShapeConstraint::updateWidthRange(pmVar3,(ShapeRange *)local_110);
  }
  else {
    RVar8 = ShapeRange::maximum(&local_98);
    local_110._8_8_ = RVar8._val;
    local_110[0] = RVar8._isUnbound;
    sVar6 = RangeValue::value((RangeValue *)local_110);
    ShapeConstraint::setChannel(pmVar3,sVar6);
    RVar8 = ShapeRange::maximum(&local_b8);
    local_110._8_8_ = RVar8._val;
    local_110[0] = RVar8._isUnbound;
    sVar6 = RangeValue::value((RangeValue *)local_110);
    ShapeConstraint::setHeight(pmVar3,sVar6);
    RVar8 = ShapeRange::maximum(&local_d8);
    local_110._8_8_ = RVar8._val;
    local_110[0] = RVar8._isUnbound;
    sVar6 = RangeValue::value((RangeValue *)local_110);
    ShapeConstraint::setWidth(pmVar3,sVar6);
  }
  if (0 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_) {
    iVar7 = 0;
    do {
      pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(specLayer->input_).super_RepeatedPtrFieldBase,iVar7);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](local_118,pTVar5);
      pSVar4 = ShapeConstraint::sequenceRange(pmVar3);
      ShapeConstraint::updateSequenceRange(this_00,pSVar4);
      pSVar4 = ShapeConstraint::batchRange(pmVar3);
      ShapeConstraint::updateBatchRange(this_00,pSVar4);
      bVar1 = ShapeConstraint::hasFixedCHW(this_00);
      if (!bVar1) {
        pSVar4 = ShapeConstraint::channelRange(pmVar3);
        ShapeConstraint::updateChannelRange(this_00,pSVar4);
        pSVar4 = ShapeConstraint::heightRange(pmVar3);
        ShapeConstraint::updateHeightRange(this_00,pSVar4);
        pSVar4 = ShapeConstraint::widthRange(pmVar3);
        ShapeConstraint::updateWidthRange(this_00,pSVar4);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeBroadcastLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& maxShape = blobShapes[specLayer.input(0)];

    ShapeRange maxSequence = maxShape.sequenceRange();
    ShapeRange maxBatch = maxShape.batchRange();
    ShapeRange maxChannel = maxShape.channelRange();
    ShapeRange maxHeight = maxShape.heightRange();
    ShapeRange maxWidth = maxShape.widthRange();

    bool inputShapesFixed = maxShape.hasFixedCHW();

    for (int i = 1; i < specLayer.input_size(); i++) {

        ShapeConstraint& inShape = blobShapes[specLayer.input(i)];

        inputShapesFixed = inputShapesFixed && inShape.hasFixedCHW();

        maxSequence = maxSequence.intersect(inShape.sequenceRange());
        maxBatch = maxBatch.intersect(inShape.batchRange());

        maxChannel = maxChannel.unify(inShape.channelRange());
        maxHeight = maxHeight.unify(inShape.heightRange());
        maxWidth = maxWidth.unify(inShape.widthRange());

    }

    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Broadcast layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Broadcast layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // Can there be ambiguity in the output of one of these? Yes.

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(maxSequence));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(maxBatch));

    if (inputShapesFixed) {
        outputShape.setChannel(maxChannel.maximum().value());
        outputShape.setHeight(maxHeight.maximum().value());
        outputShape.setWidth(maxWidth.maximum().value());
    }
    else {
        outputShape.updateChannelRange(outputShape.channelRange().intersect(maxChannel));
        outputShape.updateHeightRange(outputShape.heightRange().intersect(maxHeight));
        outputShape.updateWidthRange(outputShape.widthRange().intersect(maxWidth));
    }

    for (int i = 0; i < specLayer.input_size(); i++) {

        ShapeConstraint& inShape = blobShapes[specLayer.input(i)];
        inShape.updateSequenceRange(outputShape.sequenceRange());
        inShape.updateBatchRange(outputShape.batchRange());

        // Load constant followed by broadcast is a common pattern. If one of the inputs was from a
        // load constant layer, it will have a fixed shape, so we don't need to update shape information
        // in this case.

        if (!inShape.hasFixedCHW()) {
            inShape.updateChannelRange(outputShape.channelRange());
            inShape.updateHeightRange(outputShape.heightRange());
            inShape.updateWidthRange(outputShape.widthRange());
        }

    }


#if COREML_VALIDATOR_VERBOSE
    std::cout << "Broadcast layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Broadcast layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}